

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::testDepthStencilSupported
          (TestStatus *__return_storage_ptr__,Context *context)

{
  bool bVar1;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  bVar1 = optimalTilingFeaturesSupported(context,VK_FORMAT_X8_D24_UNORM_PACK32,0x200);
  if (!bVar1) {
    bVar1 = optimalTilingFeaturesSupported(context,VK_FORMAT_D32_SFLOAT,0x200);
    if (!bVar1) {
      local_30 = local_20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,
                 "Doesn\'t support one of VK_FORMAT_X8_D24_UNORM_PACK32 or VK_FORMAT_D32_SFLOAT","")
      ;
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_30,local_28 + (long)local_30
                );
      goto LAB_0044e928;
    }
  }
  bVar1 = optimalTilingFeaturesSupported(context,VK_FORMAT_D24_UNORM_S8_UINT,0x200);
  if (!bVar1) {
    bVar1 = optimalTilingFeaturesSupported(context,VK_FORMAT_D32_SFLOAT_S8_UINT,0x200);
    if (!bVar1) {
      local_30 = local_20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,
                 "Doesn\'t support one of VK_FORMAT_D24_UNORM_S8_UINT or VK_FORMAT_D32_SFLOAT_S8_UINT"
                 ,"");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_30,local_28 + (long)local_30
                );
      goto LAB_0044e928;
    }
  }
  local_30 = local_20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"Required depth/stencil formats supported","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_30,local_28 + (long)local_30);
LAB_0044e928:
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testDepthStencilSupported (Context& context)
{
	if (!optimalTilingFeaturesSupported(context, VK_FORMAT_X8_D24_UNORM_PACK32, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT) &&
		!optimalTilingFeaturesSupported(context, VK_FORMAT_D32_SFLOAT, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
		return tcu::TestStatus::fail("Doesn't support one of VK_FORMAT_X8_D24_UNORM_PACK32 or VK_FORMAT_D32_SFLOAT");

	if (!optimalTilingFeaturesSupported(context, VK_FORMAT_D24_UNORM_S8_UINT, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT) &&
		!optimalTilingFeaturesSupported(context, VK_FORMAT_D32_SFLOAT_S8_UINT, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
		return tcu::TestStatus::fail("Doesn't support one of VK_FORMAT_D24_UNORM_S8_UINT or VK_FORMAT_D32_SFLOAT_S8_UINT");

	return tcu::TestStatus::pass("Required depth/stencil formats supported");
}